

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.cxx
# Opt level: O1

bool __thiscall
cmVariableRequiresCommand::InitialPass
          (cmVariableRequiresCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  pointer pbVar7;
  uint uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testVariable;
  string message;
  string notSet;
  string resultVariable;
  long *local_120 [2];
  long local_110 [2];
  string local_100;
  cmState *local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  string local_98;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  bVar2 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0035,
                     "The variable_requires command should not be called; see CMP0035.");
  bVar6 = true;
  if (!bVar2) {
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7) < 0x41) {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"called with incorrect number of arguments","");
      cmCommand::SetError(&this->super_cmCommand,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
    }
    else {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar1,pcVar1 + pbVar7->_M_string_length);
      bVar2 = cmMakefile::IsOn((this->super_cmCommand).Makefile,&local_100);
      if (bVar2) {
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar1 = pbVar7[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar1,pcVar1 + pbVar7[1]._M_string_length);
        local_b8 = &local_a8;
        local_b0 = 0;
        local_a8 = 0;
        local_e0 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar2 = true;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7) < 0x41) {
          bVar6 = false;
        }
        else {
          uVar9 = 2;
          uVar8 = 3;
          bVar6 = false;
          local_58 = args;
          do {
            bVar3 = cmMakefile::IsOn((this->super_cmCommand).Makefile,pbVar7 + uVar9);
            if (!bVar3) {
              std::__cxx11::string::_M_append
                        ((char *)&local_b8,
                         (ulong)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_b8);
              pcVar4 = cmState::GetCacheEntryValue
                                 (local_e0,(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar9);
              if (pcVar4 == (char *)0x0) {
                bVar2 = false;
              }
              else {
                pbVar7 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ADVANCED","");
                bVar2 = cmState::GetCacheEntryPropertyAsBool(local_e0,pbVar7 + uVar9,&local_78);
                args = local_58;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
              }
              if (bVar2 != false) {
                bVar6 = true;
              }
              bVar2 = false;
            }
            uVar9 = (ulong)uVar8;
            pbVar7 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar8 = uVar8 + 1;
          } while (uVar9 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7
                                  >> 5));
        }
        pcVar4 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&local_98);
        bVar3 = pcVar4 == (char *)0x0;
        if (!bVar3 && bVar2 == false) {
          this_00 = (this->super_cmCommand).Makefile;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar4,pcVar4 + sVar5)
          ;
          bVar3 = cmMakefile::IsOn(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar3 != false) {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_98,bVar2);
        }
        if (bVar2 == false) {
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"Variable assertion failed:\n","");
          local_120[0] = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,local_100._M_dataplus._M_p,
                     local_100._M_dataplus._M_p + local_100._M_string_length);
          std::__cxx11::string::append((char *)local_120);
          std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_120[0]);
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
          std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_b8);
          std::__cxx11::string::append((char *)local_d8);
          local_120[0] = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,local_100._M_dataplus._M_p,
                     local_100._M_dataplus._M_p + local_100._M_string_length);
          std::__cxx11::string::append((char *)local_120);
          std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_120[0]);
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
          if (bVar6) {
            std::__cxx11::string::append((char *)local_d8);
          }
          cmSystemTools::Error((char *)local_d8[0],(char *)0x0,(char *)0x0,(char *)0x0);
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      bVar6 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return bVar6;
}

Assistant:

bool cmVariableRequiresCommand
::InitialPass(std::vector<std::string>const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0035,
      "The variable_requires command should not be called; see CMP0035."))
    { return true; }
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string testVariable = args[0];
  if(!this->Makefile->IsOn(testVariable))
    {
    return true;
    }
  std::string resultVariable = args[1];
  bool requirementsMet = true;
  std::string notSet;
  bool hasAdvanced = false;
  cmState* state = this->Makefile->GetState();
  for(unsigned int i = 2; i < args.size(); ++i)
    {
    if(!this->Makefile->IsOn(args[i]))
      {
      requirementsMet = false;
      notSet += args[i];
      notSet += "\n";
      if(state->GetCacheEntryValue(args[i]) &&
          state->GetCacheEntryPropertyAsBool(args[i], "ADVANCED"))
        {
        hasAdvanced = true;
        }
      }
    }
  const char* reqVar = this->Makefile->GetDefinition(resultVariable);
  // if reqVar is unset, then set it to requirementsMet
  // if reqVar is set to true, but requirementsMet is false , then
  // set reqVar to false.
  if(!reqVar || (!requirementsMet && this->Makefile->IsOn(reqVar)))
    {
    this->Makefile->AddDefinition(resultVariable, requirementsMet);
    }

  if(!requirementsMet)
    {
    std::string message = "Variable assertion failed:\n";
    message += testVariable +
      " Requires that the following unset variables are set:\n";
    message += notSet;
    message += "\nPlease set them, or set ";
    message += testVariable + " to false, and re-configure.\n";
    if(hasAdvanced)
      {
      message +=
        "One or more of the required variables is advanced."
        "  To set the variable, you must turn on advanced mode in cmake.";
      }
    cmSystemTools::Error(message.c_str());
    }

  return true;
}